

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O2

word * Gla_ObjTruthNode(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Vec_Int_t *p_00;
  word *pwVar2;
  int iVar3;
  
  p_00 = p->vTtNums;
  pwVar2 = p->vTtMemory->pArray;
  iVar1 = p->nTtWords;
  iVar3 = Gia_ObjId(p,pObj);
  iVar3 = Vec_IntEntry(p_00,iVar3);
  return pwVar2 + (long)iVar3 * (long)iVar1;
}

Assistant:

static inline word * Gla_ObjTruthNode( Gia_Man_t * p, Gia_Obj_t * pObj ) { return Vec_WrdArray(p->vTtMemory) + p->nTtWords * Gia_ObjNum(p, pObj);                    }